

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

PolicyStatus __thiscall
cmStateSnapshot::GetPolicy(cmStateSnapshot *this,PolicyID id,bool parent_scope)

{
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar1;
  iterator other;
  bool bVar2;
  PolicyStatus PVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  PointerType pPVar6;
  iterator other_00;
  undefined1 local_88 [8];
  PositionType p;
  PositionType e;
  iterator root;
  iterator leaf;
  iterator dir;
  byte local_1d;
  PolicyStatus status;
  bool parent_scope_local;
  PolicyID id_local;
  cmStateSnapshot *this_local;
  
  PVar3 = cmPolicies::GetPolicyStatus(id);
  if ((PVar3 != REQUIRED_ALWAYS) && (PVar3 != REQUIRED_IF_USED)) {
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
    leaf.Position = (PositionType)(pSVar4->BuildSystemDirectory).Tree;
    local_1d = parent_scope;
    while( true ) {
      bVar2 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::IsValid
                        ((iterator *)&leaf.Position);
      if (!bVar2) {
        __assert_fail("dir.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmStateSnapshot.cxx"
                      ,0xb5,
                      "cmPolicies::PolicyStatus cmStateSnapshot::GetPolicy(cmPolicies::PolicyID, bool) const"
                     );
      }
      pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)&leaf.Position);
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&pBVar5->DirectoryEnd);
      root.Position = (PositionType)(pSVar4->Policies).Tree;
      leaf.Tree = (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)(pSVar4->Policies).Position;
      pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)&leaf.Position);
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&pBVar5->DirectoryEnd);
      pcVar1 = (pSVar4->PolicyRoot).Tree;
      root.Tree = (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)(pSVar4->PolicyRoot).Position;
      while (other.Position = (PositionType)root.Tree, other.Tree = pcVar1,
            bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=
                              ((iterator *)&root.Position,other), bVar2) {
        if ((local_1d & 1) == 0) {
          pPVar6 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator->
                             ((iterator *)&root.Position);
          bVar2 = cmPolicies::PolicyMap::IsDefined(&pPVar6->super_PolicyMap,id);
          if (bVar2) {
            pPVar6 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator->
                               ((iterator *)&root.Position);
            PVar3 = cmPolicies::PolicyMap::Get(&pPVar6->super_PolicyMap,id);
            return PVar3;
          }
        }
        else {
          local_1d = 0;
        }
        cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator++
                  ((iterator *)&root.Position);
      }
      pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)&leaf.Position);
      p.Position = (PositionType)(pBVar5->DirectoryEnd).Tree;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         ((iterator *)&p.Position);
      local_88 = (undefined1  [8])(pSVar4->DirectoryParent).Tree;
      p.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(pSVar4->DirectoryParent).Position;
      other_00 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Root(&this->State->SnapshotData);
      bVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==
                        ((iterator *)local_88,other_00);
      if (bVar2) break;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         ((iterator *)local_88);
      leaf.Position = (PositionType)(pSVar4->BuildSystemDirectory).Tree;
    }
  }
  return PVar3;
}

Assistant:

cmPolicies::PolicyStatus cmStateSnapshot::GetPolicy(cmPolicies::PolicyID id,
                                                    bool parent_scope) const
{
  cmPolicies::PolicyStatus status = cmPolicies::GetPolicyStatus(id);

  if (status == cmPolicies::REQUIRED_ALWAYS ||
      status == cmPolicies::REQUIRED_IF_USED) {
    return status;
  }

  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator dir =
    this->Position->BuildSystemDirectory;

  while (true) {
    assert(dir.IsValid());
    cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator leaf =
      dir->DirectoryEnd->Policies;
    cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator root =
      dir->DirectoryEnd->PolicyRoot;
    for (; leaf != root; ++leaf) {
      if (parent_scope) {
        parent_scope = false;
        continue;
      }
      if (leaf->IsDefined(id)) {
        status = leaf->Get(id);
        return status;
      }
    }
    cmStateDetail::PositionType e = dir->DirectoryEnd;
    cmStateDetail::PositionType p = e->DirectoryParent;
    if (p == this->State->SnapshotData.Root()) {
      break;
    }
    dir = p->BuildSystemDirectory;
  }
  return status;
}